

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O0

void __thiscall
trento::Event::compute_reduced_thickness<double(*)(double,double)>
          (Event *this,_func_double_double_double *gen_mean)

{
  code *pcVar1;
  reference pdVar2;
  code *in_RSI;
  long in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double t;
  int ix;
  int iy;
  double iycm;
  double ixcm;
  double sum;
  double *in_stack_ffffffffffffff28;
  sub_array<double,_1UL> *this_00;
  undefined1 *idx;
  multi_array_ref<double,_2UL> *in_stack_ffffffffffffff48;
  undefined1 local_58 [32];
  double local_38;
  int local_30;
  int local_2c;
  double local_28;
  double local_20;
  double local_18;
  code *local_10;
  
  local_18 = 0.0;
  local_20 = 0.0;
  local_28 = 0.0;
  local_10 = in_RSI;
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x30); local_2c = local_2c + 1) {
    for (local_30 = 0; pcVar1 = local_10, local_30 < *(int *)(in_RDI + 0x30);
        local_30 = local_30 + 1) {
      this_00 = *(sub_array<double,_1UL> **)(in_RDI + 0x20);
      idx = local_58;
      boost::multi_array_ref<double,_2UL>::operator[](in_stack_ffffffffffffff48,(index)idx);
      in_stack_ffffffffffffff48 =
           (multi_array_ref<double,_2UL> *)
           boost::detail::multi_array::sub_array<double,_1UL>::operator[]
                     (this_00,(index)in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff28 =
           (in_stack_ffffffffffffff48->super_const_multi_array_ref<double,_2UL,_double_*>).base_;
      boost::multi_array_ref<double,_2UL>::operator[](in_stack_ffffffffffffff48,(index)idx);
      pdVar2 = boost::detail::multi_array::sub_array<double,_1UL>::operator[]
                         (this_00,(index)in_stack_ffffffffffffff28);
      dVar3 = (double)(*pcVar1)(in_stack_ffffffffffffff28,*pdVar2);
      dVar3 = (double)this_00 * dVar3;
      boost::detail::multi_array::sub_array<double,_1UL>::~sub_array
                ((sub_array<double,_1UL> *)0x13256d);
      boost::detail::multi_array::sub_array<double,_1UL>::~sub_array
                ((sub_array<double,_1UL> *)0x13257a);
      local_38 = dVar3;
      boost::multi_array_ref<double,_2UL>::operator[](in_stack_ffffffffffffff48,(index)idx);
      pdVar2 = boost::detail::multi_array::sub_array<double,_1UL>::operator[]
                         (this_00,(index)in_stack_ffffffffffffff28);
      *pdVar2 = dVar3;
      boost::detail::multi_array::sub_array<double,_1UL>::~sub_array
                ((sub_array<double,_1UL> *)0x1325ec);
      local_18 = local_38 + local_18;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_38;
      auVar4._0_8_ = (double)local_30;
      auVar4._8_8_ = 0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_20;
      auVar4 = vfmadd213sd_fma(auVar4,auVar6,auVar8);
      local_20 = auVar4._0_8_;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_38;
      auVar5._0_8_ = (double)local_2c;
      auVar5._8_8_ = auVar4._8_8_;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_28;
      auVar4 = vfmadd213sd_fma(auVar5,auVar7,auVar9);
      local_28 = auVar4._0_8_;
    }
  }
  *(double *)(in_RDI + 0x1c0) = *(double *)(in_RDI + 0x28) * *(double *)(in_RDI + 0x28) * local_18;
  *(double *)(in_RDI + 0x1a8) = local_20 / local_18;
  *(double *)(in_RDI + 0x1b0) = local_28 / local_18;
  return;
}

Assistant:

void Event::compute_reduced_thickness(GenMean gen_mean) {
  double sum = 0.;
  double ixcm = 0.;
  double iycm = 0.;

  for (int iy = 0; iy < nsteps_; ++iy) {
    for (int ix = 0; ix < nsteps_; ++ix) {
      auto t = norm_ * gen_mean(TA_[iy][ix], TB_[iy][ix]);
      TR_[iy][ix] = t;
      sum += t;
      // Center of mass grid indices.
      // No need to multiply by dxy since it would be canceled later.
      ixcm += t * static_cast<double>(ix);
      iycm += t * static_cast<double>(iy);
    }
  }

  multiplicity_ = dxy_ * dxy_ * sum;
  ixcm_ = ixcm / sum;
  iycm_ = iycm / sum;
}